

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# possible-contents.cpp
# Opt level: O3

bool __thiscall
wasm::anon_unknown_183::Flower::updateContents
          (Flower *this,LocationIndex locationIndex,PossibleContents *newContents)

{
  pointer pFVar1;
  __index_type _Var2;
  byte bVar3;
  __index_type _Var4;
  pointer pLVar5;
  pointer pLVar6;
  element_type *exprLoc;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var7;
  ulong uVar8;
  anon_union_16_6_1532cd5a_for_Literal_0 *paVar9;
  HeapTypeKind HVar10;
  uint uVar11;
  Struct *pSVar12;
  Type TVar13;
  ulong uVar14;
  undefined1 uVar15;
  uint uVar16;
  PossibleContents *__rhs;
  ulong uVar17;
  undefined1 local_100 [8];
  PossibleContents oldContents;
  Literal local_d8;
  Flower *local_c0;
  LocationIndex local_b4;
  undefined1 local_b0 [4];
  LocationIndex locationIndex_local;
  Literal lit;
  undefined1 local_90 [8];
  bool worthSendingMore;
  Type local_80;
  undefined1 auStack_78 [8];
  bool __ret;
  undefined1 local_68;
  undefined1 local_58 [8];
  bool worthSendingMoreTemp;
  __index_type local_40;
  element_type *local_38;
  
  pLVar5 = (this->locations).
           super__Vector_base<wasm::(anonymous_namespace)::Flower::LocationInfo,_std::allocator<wasm::(anonymous_namespace)::Flower::LocationInfo>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar17 = (ulong)locationIndex;
  uVar14 = ((long)(this->locations).
                  super__Vector_base<wasm::(anonymous_namespace)::Flower::LocationInfo,_std::allocator<wasm::(anonymous_namespace)::Flower::LocationInfo>_>
                  ._M_impl.super__Vector_impl_data._M_finish - (long)pLVar5 >> 3) *
           0x2e8ba2e8ba2e8ba3;
  local_b4 = locationIndex;
  local_38 = (element_type *)newContents;
  if (uVar14 < uVar17 || uVar14 - uVar17 == 0) {
    __assert_fail("index < locations.size()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/possible-contents.cpp"
                  ,0x7b5,
                  "PossibleContents &wasm::(anonymous namespace)::Flower::getContents(LocationIndex)"
                 );
  }
  __rhs = &pLVar5[uVar17].contents;
  std::__detail::__variant::
  _Copy_ctor_base<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
  ::_Copy_ctor_base((_Copy_ctor_base<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
                     *)local_100,
                    (_Copy_ctor_base<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
                     *)__rhs);
  pLVar6 = (this->locations).
           super__Vector_base<wasm::(anonymous_namespace)::Flower::LocationInfo,_std::allocator<wasm::(anonymous_namespace)::Flower::LocationInfo>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar14 = ((long)(this->locations).
                  super__Vector_base<wasm::(anonymous_namespace)::Flower::LocationInfo,_std::allocator<wasm::(anonymous_namespace)::Flower::LocationInfo>_>
                  ._M_impl.super__Vector_impl_data._M_finish - (long)pLVar6 >> 3) *
           0x2e8ba2e8ba2e8ba3;
  if (uVar14 < uVar17 || uVar14 - uVar17 == 0) {
    __assert_fail("index < locations.size()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/possible-contents.cpp"
                  ,0x7b0,
                  "const Location &wasm::(anonymous namespace)::Flower::getLocation(LocationIndex)")
    ;
  }
  exprLoc = *(element_type **)
             &pLVar6[uVar17].location.
              super__Variant_base<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::LocalLocation,_wasm::ResultLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::CaughtExnRefLocation,_wasm::NullLocation,_wasm::ConeReadLocation>
              .
              super__Move_assign_alias<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::LocalLocation,_wasm::ResultLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::CaughtExnRefLocation,_wasm::NullLocation,_wasm::ConeReadLocation>
  ;
  uVar14 = *(ulong *)((long)&pLVar6[uVar17].location.
                             super__Variant_base<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::LocalLocation,_wasm::ResultLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::CaughtExnRefLocation,_wasm::NullLocation,_wasm::ConeReadLocation>
                             .
                             super__Move_assign_alias<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::LocalLocation,_wasm::ResultLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::CaughtExnRefLocation,_wasm::NullLocation,_wasm::ConeReadLocation>
                             .
                             super__Copy_assign_alias<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::LocalLocation,_wasm::ResultLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::CaughtExnRefLocation,_wasm::NullLocation,_wasm::ConeReadLocation>
                             .
                             super__Move_ctor_alias<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::LocalLocation,_wasm::ResultLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::CaughtExnRefLocation,_wasm::NullLocation,_wasm::ConeReadLocation>
                             .
                             super__Copy_ctor_alias<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::LocalLocation,_wasm::ResultLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::CaughtExnRefLocation,_wasm::NullLocation,_wasm::ConeReadLocation>
                             .
                             super__Variant_storage_alias<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::LocalLocation,_wasm::ResultLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::CaughtExnRefLocation,_wasm::NullLocation,_wasm::ConeReadLocation>
                             ._M_u + 8);
  _Var2 = pLVar6[uVar17].location.
          super__Variant_base<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::LocalLocation,_wasm::ResultLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::CaughtExnRefLocation,_wasm::NullLocation,_wasm::ConeReadLocation>
          .
          super__Move_assign_alias<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::LocalLocation,_wasm::ResultLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::CaughtExnRefLocation,_wasm::NullLocation,_wasm::ConeReadLocation>
          .
          super__Copy_assign_alias<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::LocalLocation,_wasm::ResultLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::CaughtExnRefLocation,_wasm::NullLocation,_wasm::ConeReadLocation>
          .
          super__Move_ctor_alias<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::LocalLocation,_wasm::ResultLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::CaughtExnRefLocation,_wasm::NullLocation,_wasm::ConeReadLocation>
          .
          super__Copy_ctor_alias<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::LocalLocation,_wasm::ResultLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::CaughtExnRefLocation,_wasm::NullLocation,_wasm::ConeReadLocation>
          .
          super__Variant_storage_alias<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::LocalLocation,_wasm::ResultLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::CaughtExnRefLocation,_wasm::NullLocation,_wasm::ConeReadLocation>
          ._M_index;
  if (_Var2 == '\0') {
    bVar3 = *(byte *)&(exprLoc->type).id;
    if ((bVar3 | 8) == 0x4a) {
      if (bVar3 == 0x4a) {
        paVar9 = (anon_union_16_6_1532cd5a_for_Literal_0 *)&exprLoc->values;
        lit.type.id = 0;
      }
      else {
        if (bVar3 != 0x42) {
          handle_unreachable("bad packed read",
                             "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/possible-contents.cpp"
                             ,0xb1f);
        }
        paVar9 = &(exprLoc->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].field_0;
        lit.type.id = (uintptr_t)
                      (uint)(exprLoc->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems
                            [0].field_0.i32;
      }
      if ((char)(exprLoc->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id ==
          '\x01') {
        p_Var7 = (paVar9->gcData).super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi;
        uVar8._0_4_ = p_Var7->_M_use_count;
        uVar8._4_4_ = p_Var7->_M_weak_count;
        if ((uVar8 < 7) || ((uVar8 & 1) != 0)) {
          __assert_fail("ref->type.isRef()",
                        "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/possible-contents.cpp"
                        ,0xb27,
                        "void wasm::(anonymous namespace)::Flower::filterPackedDataReads(PossibleContents &, const ExpressionLocation &)"
                       );
        }
        local_58 = (undefined1  [8])wasm::Type::getHeapType((Type *)&p_Var7->_M_use_count);
        HVar10 = HeapType::getKind((HeapType *)local_58);
        if (HVar10 == Array) {
          HeapType::getArray((HeapType *)auStack_78);
        }
        else {
          if (HVar10 != Struct) {
            local_68 = 0;
            __assert_fail("field",
                          "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/possible-contents.cpp"
                          ,0xb29,
                          "void wasm::(anonymous namespace)::Flower::filterPackedDataReads(PossibleContents &, const ExpressionLocation &)"
                         );
          }
          pSVar12 = HeapType::getStruct((HeapType *)local_58);
          pFVar1 = (pSVar12->fields).super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>.
                   _M_impl.super__Vector_impl_data._M_start + lit.type.id;
          auStack_78 = (undefined1  [8])(pFVar1->type).id;
          ___ret = pFVar1->packedType;
          unique0x10000554 = pFVar1->mutable_;
        }
        local_68 = 1;
        if ((___ret != not_packed) && (auStack_78 != (undefined1  [8])0x2)) goto LAB_00700f13;
        if (___ret != not_packed) {
          if ((local_38->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].field_0.
              v128[8] == '\x01') {
            uVar11 = Field::getByteSize((Field *)auStack_78);
            local_90._0_4_ = uVar11 * -8 + 0x20;
            local_80.id = 2;
            PossibleContents::getLiteral((Literal *)local_b0,(PossibleContents *)local_38);
            Literal::shl((Literal *)local_58,(Literal *)local_b0,(Literal *)local_90);
            Literal::operator=((Literal *)local_b0,(Literal *)local_58);
            Literal::~Literal((Literal *)local_58);
            Literal::shrS((Literal *)local_58,(Literal *)local_b0,(Literal *)local_90);
            Literal::operator=((Literal *)local_b0,(Literal *)local_58);
            Literal::~Literal((Literal *)local_58);
            Literal::Literal(&local_d8,(Literal *)local_b0);
            PossibleContents::literal((PossibleContents *)local_58,&local_d8);
            oldContents.value.
            super__Variant_base<wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
            .
            super__Move_assign_alias<wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
            .
            super__Copy_assign_alias<wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
            .
            super__Move_ctor_alias<wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
            .
            super__Copy_ctor_alias<wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
            .
            super__Variant_storage_alias<wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
            ._24_8_ = local_38;
            (*std::__detail::__variant::
              __gen_vtable<std::__detail::__variant::__variant_idx_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:609:4)_&&,_const_std::variant<wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>_&>
              ::_S_vtable._M_arr[(long)(char)local_40 + 1]._M_data)
                      ((anon_class_8_1_8991fb9c_conflict1 *)
                       &oldContents.value.
                        super__Variant_base<wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
                        .
                        super__Move_assign_alias<wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
                        .
                        super__Copy_assign_alias<wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
                        .
                        super__Move_ctor_alias<wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
                        .
                        super__Copy_ctor_alias<wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
                        .
                        super__Variant_storage_alias<wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
                        ._M_index,
                       (variant<wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
                        *)local_58);
            std::__detail::__variant::
            _Variant_storage<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
            ::~_Variant_storage((_Variant_storage<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
                                 *)local_58);
            Literal::~Literal(&local_d8);
            Literal::~Literal((Literal *)local_b0);
            Literal::~Literal((Literal *)local_90);
          }
          else {
            TVar13 = PossibleContents::getType((PossibleContents *)local_38);
            PossibleContents::fromType((PossibleContents *)local_58,TVar13);
            local_90 = (undefined1  [8])local_38;
            (*std::__detail::__variant::
              __gen_vtable<std::__detail::__variant::__variant_idx_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:609:4)_&&,_const_std::variant<wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>_&>
              ::_S_vtable._M_arr[(long)(char)local_40 + 1]._M_data)
                      ((anon_class_8_1_8991fb9c_conflict1 *)local_90,
                       (variant<wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
                        *)local_58);
            std::__detail::__variant::
            _Variant_storage<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
            ::~_Variant_storage((_Variant_storage<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
                                 *)local_58);
          }
        }
      }
    }
    local_58[0] = 1;
    filterExpressionContents
              (this,(PossibleContents *)local_38,(ExpressionLocation *)exprLoc,(bool *)local_58);
  }
  else if (_Var2 == '\x04') {
    filterGlobalContents
              ((Flower *)this->wasm,(PossibleContents *)local_38,(GlobalLocation *)exprLoc);
  }
  else if (_Var2 == '\a') {
    local_58 = (undefined1  [8])exprLoc;
    HVar10 = HeapType::getKind((HeapType *)local_58);
    if (HVar10 == Array) {
      HeapType::getArray((HeapType *)auStack_78);
LAB_00700a67:
      local_68 = 1;
      if ((___ret != not_packed) && (auStack_78 != (undefined1  [8])0x2)) {
LAB_00700f13:
        local_68 = 1;
        __assert_fail("type == Type::i32 && \"unexpected type\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-type.h"
                      ,0x28a,"bool wasm::Field::isPacked() const");
      }
      if (___ret != not_packed) {
        if ((local_38->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].field_0.v128
            [8] != '\x01') {
          TVar13 = PossibleContents::getType((PossibleContents *)local_38);
          PossibleContents::fromType((PossibleContents *)local_58,TVar13);
          local_90 = (undefined1  [8])local_38;
          (*std::__detail::__variant::
            __gen_vtable<std::__detail::__variant::__variant_idx_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:609:4)_&&,_const_std::variant<wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>_&>
            ::_S_vtable._M_arr[(long)(char)local_40 + 1]._M_data)
                    ((anon_class_8_1_8991fb9c_conflict1 *)local_90,
                     (variant<wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
                      *)local_58);
          goto LAB_00700be4;
        }
        uVar11 = Field::getByteSize((Field *)auStack_78);
        uVar16 = 0xffffffff >> (-(char)(uVar11 * 8) & 0x1fU);
        if (0x1f < (int)(uVar11 * 8)) {
          uVar16 = 0xffffffff;
        }
        local_90._0_4_ = uVar16;
        local_80.id = 2;
        PossibleContents::getLiteral(&local_d8,(PossibleContents *)local_38);
        Literal::and_((Literal *)local_b0,&local_d8,(Literal *)local_90);
        PossibleContents::literal((PossibleContents *)local_58,(Literal *)local_b0);
        oldContents.value.
        super__Variant_base<wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
        .
        super__Move_assign_alias<wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
        .
        super__Copy_assign_alias<wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
        .
        super__Move_ctor_alias<wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
        .
        super__Copy_ctor_alias<wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
        .
        super__Variant_storage_alias<wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
        ._24_8_ = local_38;
        (*std::__detail::__variant::
          __gen_vtable<std::__detail::__variant::__variant_idx_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:609:4)_&&,_const_std::variant<wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>_&>
          ::_S_vtable._M_arr[(long)(char)local_40 + 1]._M_data)
                  ((anon_class_8_1_8991fb9c_conflict1 *)
                   &oldContents.value.
                    super__Variant_base<wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
                    .
                    super__Move_assign_alias<wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
                    .
                    super__Copy_assign_alias<wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
                    .
                    super__Move_ctor_alias<wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
                    .
                    super__Copy_ctor_alias<wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
                    .
                    super__Variant_storage_alias<wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
                    ._M_index,
                   (variant<wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
                    *)local_58);
        std::__detail::__variant::
        _Variant_storage<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
        ::~_Variant_storage((_Variant_storage<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
                             *)local_58);
        Literal::~Literal((Literal *)local_b0);
        Literal::~Literal(&local_d8);
        Literal::~Literal((Literal *)local_90);
      }
    }
    else {
      if (HVar10 == Struct) {
        pSVar12 = HeapType::getStruct((HeapType *)local_58);
        pFVar1 = (pSVar12->fields).super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>.
                 _M_impl.super__Vector_impl_data._M_start + (uVar14 & 0xffffffff);
        auStack_78 = (undefined1  [8])(pFVar1->type).id;
        ___ret = pFVar1->packedType;
        unique0x10000534 = pFVar1->mutable_;
        goto LAB_00700a67;
      }
      local_68 = 0;
      if (((element_type *)0x7c < exprLoc) ||
         (uVar11 = (uint)exprLoc & 0x7b, 4 < (uVar11 << 0x1d | uVar11 - 8 >> 3) - 10)) {
        __assert_fail("dataLoc.type.isBottom()",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/possible-contents.cpp"
                      ,0xae5,
                      "void wasm::(anonymous namespace)::Flower::filterDataContents(PossibleContents &, const DataLocation &)"
                     );
      }
      local_40 = '\0';
      _Var4 = (local_38->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].field_0.
              v128[8];
      if (_Var4 != '\0') {
        if (_Var4 != 0xff) {
          (*std::__detail::__variant::
            __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>_&>
            ::_S_vtable._M_arr[(char)_Var4]._M_data)
                    ((anon_class_1_0_00000001 *)local_90,
                     (variant<wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
                      *)local_38);
        }
        (local_38->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].field_0.v128[8] =
             '\0';
      }
LAB_00700be4:
      std::__detail::__variant::
      _Variant_storage<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
      ::~_Variant_storage((_Variant_storage<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
                           *)local_58);
    }
  }
  PossibleContents::combine(__rhs,(PossibleContents *)local_38);
  _Var4 = pLVar5[uVar17].contents.value.
          super__Variant_base<wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
          .
          super__Move_assign_alias<wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
          .
          super__Copy_assign_alias<wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
          .
          super__Move_ctor_alias<wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
          .
          super__Copy_ctor_alias<wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
          .
          super__Variant_storage_alias<wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
          ._M_index;
  if (_Var4 == '\0') {
    uVar15 = '\x01';
    goto LAB_00700eb5;
  }
  local_90[0] = 1;
  lit.type.id = uVar14;
  local_38 = exprLoc;
  if (_Var4 == '\x03') {
    TVar13 = PossibleContents::getType(__rhs);
    if (TVar13.id < 7 || (TVar13.id & 1) != 0) {
      local_90 = (undefined1  [8])((ulong)local_90 & 0xffffffffffffff00);
    }
    else {
      normalizeConeType(this,__rhs);
    }
  }
  auStack_78[0] = 1;
  local_58 = (undefined1  [8])auStack_78;
  _worthSendingMoreTemp = __rhs;
  (*std::__detail::__variant::
    __gen_vtable<std::__detail::__variant::__variant_idx_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:1232:3)_&&,_const_std::variant<wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>_&>
    ::_S_vtable._M_arr
    [(long)(char)oldContents.value.
                 super__Variant_base<wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
                 .
                 super__Move_assign_alias<wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
                 .
                 super__Copy_assign_alias<wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
                 .
                 super__Move_ctor_alias<wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
                 .
                 super__Copy_ctor_alias<wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
                 .
                 super__Variant_storage_alias<wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
                 ._M_u._16_1_ + 1]._M_data)
            ((anon_class_16_2_9763bfdf *)local_58,
             (variant<wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
              *)local_100);
  if (auStack_78[0] == '\0') {
    if (_Var2 == '\x04') {
      local_c0 = this;
      filterGlobalContents((Flower *)this->wasm,__rhs,(GlobalLocation *)local_38);
LAB_00700e61:
      auStack_78[0] = 1;
      local_58 = (undefined1  [8])auStack_78;
      _worthSendingMoreTemp = __rhs;
      (*std::__detail::__variant::
        __gen_vtable<std::__detail::__variant::__variant_idx_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:1232:3)_&&,_const_std::variant<wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>_&>
        ::_S_vtable._M_arr
        [(long)(char)oldContents.value.
                     super__Variant_base<wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
                     .
                     super__Move_assign_alias<wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
                     .
                     super__Copy_assign_alias<wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
                     .
                     super__Move_ctor_alias<wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
                     .
                     super__Copy_ctor_alias<wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
                     .
                     super__Variant_storage_alias<wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
                     ._M_u._16_1_ + 1]._M_data)
                ((anon_class_16_2_9763bfdf *)local_58,
                 (variant<wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
                  *)local_100);
      this = local_c0;
      if (auStack_78[0] != '\0') goto LAB_00700eaf;
    }
    else if (_Var2 == '\0') {
      local_c0 = this;
      filterExpressionContents(this,__rhs,(ExpressionLocation *)local_38,(bool *)local_90);
      goto LAB_00700e61;
    }
    if (pLVar5[uVar17].contents.value.
        super__Variant_base<wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
        .
        super__Move_assign_alias<wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
        .
        super__Copy_assign_alias<wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
        .
        super__Move_ctor_alias<wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
        .
        super__Copy_ctor_alias<wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
        .
        super__Variant_storage_alias<wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
        ._M_index == '\x04') {
      __assert_fail("!contents.isMany()",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/possible-contents.cpp"
                    ,0xa03,
                    "bool wasm::(anonymous namespace)::Flower::updateContents(LocationIndex, PossibleContents)"
                   );
    }
    InsertOrderedSet<unsigned_int>::insert(&this->workQueue,&local_b4);
  }
LAB_00700eaf:
  uVar15 = local_90[0];
LAB_00700eb5:
  std::__detail::__variant::
  _Variant_storage<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
  ::~_Variant_storage((_Variant_storage<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
                       *)local_100);
  return (bool)uVar15;
}

Assistant:

bool Flower::updateContents(LocationIndex locationIndex,
                            PossibleContents newContents) {
  auto& contents = getContents(locationIndex);
  auto oldContents = contents;

#if defined(POSSIBLE_CONTENTS_DEBUG) && POSSIBLE_CONTENTS_DEBUG >= 2
  std::cout << "\nupdateContents\n";
  dump(getLocation(locationIndex));
  contents.dump(std::cout, &wasm);
  std::cout << "\n with new contents \n";
  newContents.dump(std::cout, &wasm);
  std::cout << '\n';
#endif

  auto location = getLocation(locationIndex);

  // Handle special cases: Some locations can only contain certain contents, so
  // filter accordingly. For example, if anyref arrives to a non-nullable
  // location, we know it must be (ref any). As a result, each time we update
  // the contents at a location we are both merging in the new contents, and
  // filtering based on what we know of the location.
  //
  // The operation of merging in new content and also filtering is *not*
  // commutative. Set intersection and union of course is, but the shapes we
  // work with here are limited, e.g. we have cones which include all children
  // up to a fixed depth (and not specific children or each with a different
  // depth). For example, if we start e.g. with a ref.func literal, and a
  // ref.null arrives, then merging results in a cone that allows null, as that
  // is the best shape we have that includes both. If the location is non-
  // nullable then the cone becomes non-nullable, so we ended up with something
  // worse than the original ref.func literal. In contrast, if we filtered the
  // new contents first, the null would vanish (as no null is possible in the
  // non-nullable location), so that order ends up better.
  //
  // For those reasons we filter the new contents arriving and also the merged
  // contents afterwards, to try to get the best results. This also avoids some
  // nondeterminism hazards with different orders. TODO: This does not avoid
  // them all, in principle, due to lack of commutativity. Using a deterministic
  // order (like abstract interpretation) would fix that.
  if (auto* dataLoc = std::get_if<DataLocation>(&location)) {
    // Filtering data contents is especially important to do before, and not
    // necessary afterwards. For example, imagine a location that contains an
    // i8 which is sent a 0 and then 0x100. If we filter only after, then we'd
    // combine 0 and 0x100 first and get "unknown integer"; only by filtering
    // 0x100 to 0 beforehand (since 0x100 & 0xff => 0) will we combine 0 and 0
    // and not change anything, which is best.
    filterDataContents(newContents, *dataLoc);
#if defined(POSSIBLE_CONTENTS_DEBUG) && POSSIBLE_CONTENTS_DEBUG >= 2
    std::cout << "  pre-filtered data contents:\n";
    newContents.dump(std::cout, &wasm);
    std::cout << '\n';
#endif
  } else if (auto* exprLoc = std::get_if<ExpressionLocation>(&location)) {
    if (exprLoc->expr->is<StructGet>() || exprLoc->expr->is<ArrayGet>()) {
      // As mentioned above, data locations can have packed reads, which require
      // filtering before. Note that there is no need to filter atomic RMW
      // operations here because they always do unsigned reads.
      filterPackedDataReads(newContents, *exprLoc);
#if defined(POSSIBLE_CONTENTS_DEBUG) && POSSIBLE_CONTENTS_DEBUG >= 2
      std::cout << "  pre-filtered packed read contents:\n";
      newContents.dump(std::cout, &wasm);
      std::cout << '\n';
#endif
    }

    // Generic filtering. We do this both before and after.
    //
    // The outcome of this filtering does not affect whether it is worth sending
    // more later (we compute that at the end), so use a temp out var for that.
    bool worthSendingMoreTemp = true;
    filterExpressionContents(newContents, *exprLoc, worthSendingMoreTemp);
  } else if (auto* globalLoc = std::get_if<GlobalLocation>(&location)) {
    // Generic filtering. We do this both before and after.
    filterGlobalContents(newContents, *globalLoc);
  }

  // After filtering newContents, combine it onto the existing contents.
  contents.combine(newContents);

  if (contents.isNone()) {
    // There is still nothing here. There is nothing more to do here but to
    // return that it is worth sending more.
    return true;
  }

  // It is not worth sending any more to this location if we are now in the
  // worst possible case, as no future value could cause any change.
  bool worthSendingMore = true;
  if (contents.isConeType()) {
    if (!contents.getType().isRef()) {
      // A cone type of a non-reference is the worst case, since subtyping is
      // not relevant there, and so if we only know something about the type
      // then we already know nothing beyond what the type in the wasm tells us
      // (and from there we can only go to Many).
      worthSendingMore = false;
    } else {
      // Normalize all reference cones. There is never a point to flow around
      // anything non-normalized, which might lead to extra work. For example,
      // if A has no subtypes, then a full cone for A is really the same as one
      // with depth 0 (an exact type). And we don't want to see the full cone
      // arrive and think it was an improvement over the one with depth 0 and do
      // more flowing based on that.
      normalizeConeType(contents);
    }
  }

  // Check if anything changed.
  if (contents == oldContents) {
    // Nothing actually changed, so just return.
    return worthSendingMore;
  }

  // Handle filtering (see comment earlier, this is the later filtering stage).
  bool filtered = false;
  if (auto* exprLoc = std::get_if<ExpressionLocation>(&location)) {
    // TODO: Replace this with specific filterFoo or flowBar methods like we
    //       have for filterGlobalContents. That could save a little wasted work
    //       here. Might be best to do that after the spec is fully stable.
    filterExpressionContents(contents, *exprLoc, worthSendingMore);
    filtered = true;
  } else if (auto* globalLoc = std::get_if<GlobalLocation>(&location)) {
    filterGlobalContents(contents, *globalLoc);
    filtered = true;
  }

  // Check if anything changed after filtering, if we did so.
  if (filtered) {
#if defined(POSSIBLE_CONTENTS_DEBUG) && POSSIBLE_CONTENTS_DEBUG >= 2
    std::cout << "  filtered contents:\n";
    contents.dump(std::cout, &wasm);
    std::cout << '\n';
#endif

    if (contents == oldContents) {
      return worthSendingMore;
    }
  }

#if defined(POSSIBLE_CONTENTS_DEBUG) && POSSIBLE_CONTENTS_DEBUG >= 2
  std::cout << "  updateContents has something new\n";
  contents.dump(std::cout, &wasm);
  std::cout << '\n';
#endif

  // After filtering we should always have more precise information than "many"
  // - in the worst case, we can have the type declared in the wasm.
  assert(!contents.isMany());

  // Add a work item if there isn't already.
  workQueue.insert(locationIndex);

  return worthSendingMore;
}